

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O3

void uv_library_shutdown(void)

{
  if (uv_library_shutdown_was_shutdown == '\0') {
    uv__process_title_cleanup();
    uv__signal_cleanup();
    uv__threadpool_cleanup();
    uv_library_shutdown_was_shutdown = '\x01';
  }
  return;
}

Assistant:

__attribute__((destructor))
#endif
void uv_library_shutdown(void) {
  static int was_shutdown;

  if (uv__load_relaxed(&was_shutdown))
    return;

  uv__process_title_cleanup();
  uv__signal_cleanup();
#ifdef __MVS__
  /* TODO(itodorov) - zos: revisit when Woz compiler is available. */
  uv__os390_cleanup();
#else
  uv__threadpool_cleanup();
#endif
  uv__store_relaxed(&was_shutdown, 1);
}